

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int uv_timer_stop(uv_timer_t *handle)

{
  uv_timer_t *handle_local;
  
  if ((((handle->flags & 0x4000) != 0) &&
      (heap_remove((heap *)&handle->loop->timer_heap,(heap_node *)handle->heap_node,timer_less_than)
      , (handle->flags & 0x4000) != 0)) &&
     (handle->flags = handle->flags & 0xffffbfff, (handle->flags & 0x2000) != 0)) {
    handle->loop->active_handles = handle->loop->active_handles - 1;
  }
  return 0;
}

Assistant:

int uv_timer_stop(uv_timer_t* handle) {
  if (!uv__is_active(handle))
    return 0;

  heap_remove((struct heap*) &handle->loop->timer_heap,
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_stop(handle);

  return 0;
}